

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

WebPEncodingError
StoreImageToBitMask(VP8LBitWriter *bw,int width,int histo_bits,VP8LBackwardRefs *refs,
                   uint16_t *histogram_symbols,HuffmanTreeCode *huffman_codes)

{
  byte bVar1;
  ushort uVar2;
  uint32_t uVar3;
  byte bVar4;
  PixOrCopy *pPVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  HuffmanTreeCode *pHVar15;
  uint16_t **ppuVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  VP8LRefsCursor c;
  uint local_88;
  uint local_84;
  VP8LRefsCursor local_48;
  
  bVar4 = (byte)histo_bits;
  uVar12 = (width + (1 << (bVar4 & 0x1f))) - 1U >> (bVar4 & 0x1f);
  uVar14 = -1 << (bVar4 & 0x1f);
  if (histo_bits == 0) {
    uVar12 = 1;
    uVar14 = 0;
  }
  uVar2 = *histogram_symbols;
  VP8LRefsCursorInit(&local_48,refs);
  if (local_48.cur_pos != (PixOrCopy *)0x0) {
    pHVar15 = huffman_codes + (ulong)uVar2 * 5;
    uVar10 = 0;
    uVar17 = 0;
    local_84 = 0;
    local_88 = 0;
    do {
      pPVar5 = local_48.cur_pos;
      if ((local_84 != (uVar10 & uVar14)) || (local_88 != (uVar17 & uVar14))) {
        pHVar15 = huffman_codes +
                  (ulong)histogram_symbols
                         [(int)(((int)uVar10 >> (bVar4 & 0x1f)) +
                               ((int)uVar17 >> (bVar4 & 0x1f)) * uVar12)] * 5;
        local_88 = uVar17 & uVar14;
        local_84 = uVar10 & uVar14;
      }
      if ((local_48.cur_pos)->mode == '\x01') {
        uVar6 = (uint)pHVar15->code_lengths[(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118]
        ;
        if (pHVar15->code_lengths[(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118] != 0) {
          uVar2 = pHVar15->codes[(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118];
          iVar19 = bw->used_;
          if (0x1f < iVar19) {
            VP8LPutBitsFlushBits(bw);
            iVar19 = bw->used_;
          }
          bw->bits_ = bw->bits_ | (ulong)uVar2 << ((byte)iVar19 & 0x3f);
LAB_0013e6b9:
          bw->used_ = uVar6 + iVar19;
        }
      }
      else if ((local_48.cur_pos)->mode == '\0') {
        ppuVar16 = &pHVar15->codes;
        lVar11 = 0;
        do {
          uVar6 = pPVar5->argb_or_distance >> (("\x01\x02"[lVar11] & 3) << 3) & 0xff;
          bVar1 = *(byte *)((long)ppuVar16[-1] + (ulong)uVar6);
          if (bVar1 != 0) {
            uVar2 = (*ppuVar16)[uVar6];
            iVar19 = bw->used_;
            if (0x1f < iVar19) {
              VP8LPutBitsFlushBits(bw);
              iVar19 = bw->used_;
            }
            bw->bits_ = bw->bits_ | (ulong)uVar2 << ((byte)iVar19 & 0x3f);
            bw->used_ = (uint)bVar1 + iVar19;
          }
          lVar11 = lVar11 + 1;
          ppuVar16 = ppuVar16 + 3;
        } while (lVar11 != 4);
      }
      else {
        uVar9 = (ulong)(local_48.cur_pos)->len;
        if (uVar9 < 0x200) {
          uVar6 = (uint)kPrefixEncodeCode[uVar9].code_;
          uVar18 = (uint)kPrefixEncodeCode[uVar9].extra_bits_;
          uVar13 = (uint)""[uVar9];
        }
        else {
          uVar7 = (local_48.cur_pos)->len - 1;
          uVar6 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          uVar18 = 0x1e - (uVar6 ^ 0x1f);
          uVar13 = ~(-1 << ((byte)uVar18 & 0x1f)) & uVar7;
          uVar6 = (uint)((uVar7 >> (uVar18 & 0x1f) & 1) != 0) + (uVar6 ^ 0x1f) * 2 ^ 0x3e;
        }
        uVar3 = (local_48.cur_pos)->argb_or_distance;
        bVar1 = pHVar15->code_lengths[uVar6 + 0x100];
        iVar19 = uVar18 + bVar1;
        if (iVar19 != 0 && SCARRY4(uVar18,(uint)bVar1) == iVar19 < 0) {
          uVar2 = pHVar15->codes[uVar6 + 0x100];
          iVar8 = bw->used_;
          if (0x1f < iVar8) {
            VP8LPutBitsFlushBits(bw);
            iVar8 = bw->used_;
          }
          bw->bits_ = bw->bits_ |
                      (ulong)(uVar13 << (bVar1 & 0x1f) | (uint)uVar2) << ((byte)iVar8 & 0x3f);
          bw->used_ = iVar19 + iVar8;
        }
        if ((int)uVar3 < 0x200) {
          uVar7 = (uint)kPrefixEncodeCode[(int)uVar3].code_;
          uVar6 = (uint)kPrefixEncodeCode[(int)uVar3].extra_bits_;
          uVar9 = (ulong)""[(int)uVar3];
        }
        else {
          uVar13 = uVar3 - 1;
          uVar7 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar6 = 0x1e - (uVar7 ^ 0x1f);
          uVar9 = (ulong)(~(-1 << ((byte)uVar6 & 0x1f)) & uVar13);
          uVar7 = (uint)((uVar13 >> (uVar6 & 0x1f) & 1) != 0) + (uVar7 ^ 0x1f) * 2 ^ 0x3e;
        }
        bVar1 = pHVar15[4].code_lengths[(int)uVar7];
        if (bVar1 != 0) {
          uVar2 = pHVar15[4].codes[(int)uVar7];
          iVar19 = bw->used_;
          if (0x1f < iVar19) {
            VP8LPutBitsFlushBits(bw);
            iVar19 = bw->used_;
          }
          bw->bits_ = bw->bits_ | (ulong)uVar2 << ((byte)iVar19 & 0x3f);
          bw->used_ = (uint)bVar1 + iVar19;
        }
        if (0 < (int)uVar6) {
          iVar19 = bw->used_;
          if (0x1f < iVar19) {
            VP8LPutBitsFlushBits(bw);
            iVar19 = bw->used_;
          }
          bw->bits_ = bw->bits_ | uVar9 << ((byte)iVar19 & 0x3f);
          goto LAB_0013e6b9;
        }
      }
      for (uVar10 = uVar10 + pPVar5->len; width <= (int)uVar10; uVar10 = uVar10 - width) {
        uVar17 = uVar17 + 1;
      }
      local_48.cur_pos = local_48.cur_pos + 1;
      if (local_48.cur_pos == local_48.last_pos_) {
        VP8LRefsCursorNextBlock(&local_48);
      }
    } while (local_48.cur_pos != (PixOrCopy *)0x0);
  }
  return (WebPEncodingError)(bw->error_ != 0);
}

Assistant:

static WebPEncodingError StoreImageToBitMask(
    VP8LBitWriter* const bw, int width, int histo_bits,
    const VP8LBackwardRefs* const refs,
    const uint16_t* histogram_symbols,
    const HuffmanTreeCode* const huffman_codes) {
  const int histo_xsize = histo_bits ? VP8LSubSampleSize(width, histo_bits) : 1;
  const int tile_mask = (histo_bits == 0) ? 0 : -(1 << histo_bits);
  // x and y trace the position in the image.
  int x = 0;
  int y = 0;
  int tile_x = x & tile_mask;
  int tile_y = y & tile_mask;
  int histogram_ix = histogram_symbols[0];
  const HuffmanTreeCode* codes = huffman_codes + 5 * histogram_ix;
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    const PixOrCopy* const v = c.cur_pos;
    if ((tile_x != (x & tile_mask)) || (tile_y != (y & tile_mask))) {
      tile_x = x & tile_mask;
      tile_y = y & tile_mask;
      histogram_ix = histogram_symbols[(y >> histo_bits) * histo_xsize +
                                       (x >> histo_bits)];
      codes = huffman_codes + 5 * histogram_ix;
    }
    if (PixOrCopyIsLiteral(v)) {
      static const uint8_t order[] = { 1, 2, 0, 3 };
      int k;
      for (k = 0; k < 4; ++k) {
        const int code = PixOrCopyLiteral(v, order[k]);
        WriteHuffmanCode(bw, codes + k, code);
      }
    } else if (PixOrCopyIsCacheIdx(v)) {
      const int code = PixOrCopyCacheIdx(v);
      const int literal_ix = 256 + NUM_LENGTH_CODES + code;
      WriteHuffmanCode(bw, codes, literal_ix);
    } else {
      int bits, n_bits;
      int code;

      const int distance = PixOrCopyDistance(v);
      VP8LPrefixEncode(v->len, &code, &n_bits, &bits);
      WriteHuffmanCodeWithExtraBits(bw, codes, 256 + code, bits, n_bits);

      // Don't write the distance with the extra bits code since
      // the distance can be up to 18 bits of extra bits, and the prefix
      // 15 bits, totaling to 33, and our PutBits only supports up to 32 bits.
      VP8LPrefixEncode(distance, &code, &n_bits, &bits);
      WriteHuffmanCode(bw, codes + 4, code);
      VP8LPutBits(bw, bits, n_bits);
    }
    x += PixOrCopyLength(v);
    while (x >= width) {
      x -= width;
      ++y;
    }
    VP8LRefsCursorNext(&c);
  }
  return bw->error_ ? VP8_ENC_ERROR_OUT_OF_MEMORY : VP8_ENC_OK;
}